

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O0

void __thiscall
BSA_SpikeDecodingSynapse::initialize
          (BSA_SpikeDecodingSynapse *this,Population *n_from,Population *n_to)

{
  undefined4 uVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  Clock *pCVar4;
  Logging *pLVar5;
  size_type sVar6;
  deque<double,_std::allocator<double>_> *this_00;
  ulong uVar7;
  allocator_type *__a;
  int iVar8;
  vector<double,_std::allocator<double>_> *this_01;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  double dVar9;
  undefined1 auVar10 [16];
  int i_4;
  int i_3;
  int i_2;
  bool isEven;
  int len;
  int middle;
  int i_1;
  int i;
  value_type *in_stack_fffffffffffffee8;
  vector<Event_*,_std::allocator<Event_*>_> *in_stack_fffffffffffffef0;
  value_type_conflict3 *in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  ValueEvent *in_stack_ffffffffffffff10;
  int local_cc;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_b0;
  int local_98;
  ValueEvent local_91 [3];
  deque<double,_std::allocator<double>_> *local_28;
  int local_1c;
  long *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RSI + 0x18))();
  *(undefined4 *)(in_RDI + 0x88) = uVar1;
  uVar1 = (**(code **)(*local_18 + 8))();
  *(undefined4 *)(in_RDI + 0x8c) = uVar1;
  if (*(int *)(in_RDI + 0x88) == *(int *)(in_RDI + 0x8c)) {
    *(long **)(in_RDI + 8) = local_10;
    *(long **)(in_RDI + 0x10) = local_18;
    pCVar4 = Clock::getInstance();
    *(Clock **)(in_RDI + 0x68) = pCVar4;
    pLVar5 = Logging::getInstance();
    *(Logging **)(in_RDI + 0x90) = pLVar5;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x88); local_1c = local_1c + 1) {
      sVar6 = in_RDI + 0x70;
      this_00 = (deque<double,_std::allocator<double>_> *)operator_new(0x20);
      ValueEvent::ValueEvent(in_stack_ffffffffffffff10);
      local_28 = this_00;
      std::vector<Event_*,_std::allocator<Event_*>_>::push_back
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      in_stack_fffffffffffffef8 = (value_type_conflict3 *)(in_RDI + 0x50);
      in_stack_ffffffffffffff00 =
           (vector<double,_std::allocator<double>_> *)(long)*(int *)(in_RDI + 0x88);
      uVar7 = (ulong)**(double **)(in_RDI + 0x18);
      __a = (allocator_type *)
            (uVar7 | (long)(**(double **)(in_RDI + 0x18) - 9.223372036854776e+18) &
                     (long)uVar7 >> 0x3f);
      local_91[0].super_Event._1_8_ = 0;
      in_stack_ffffffffffffff10 = local_91;
      std::allocator<double>::allocator((allocator<double> *)0x179a03);
      std::deque<double,_std::allocator<double>_>::deque
                (this_00,sVar6,(value_type_conflict3 *)in_stack_ffffffffffffff10,__a);
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::assign((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
               (value_type *)0x179a3b);
      std::deque<double,_std::allocator<double>_>::~deque
                ((deque<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      std::allocator<double>::~allocator((allocator<double> *)0x179a57);
    }
    if (*(int *)(*(long *)(in_RDI + 0x18) + 0x18) == 1) {
      for (local_98 = 0; (double)local_98 < **(double **)(in_RDI + 0x18); local_98 = local_98 + 1) {
        this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x38);
        cos(((double)local_98 * 6.283185307179586) / (**(double **)(in_RDI + 0x18) - 1.0));
        std::vector<double,_std::allocator<double>_>::push_back
                  (this_01,(value_type_conflict3 *)in_stack_fffffffffffffee8);
      }
    }
    else if (*(int *)(*(long *)(in_RDI + 0x18) + 0x18) == 0) {
      dVar9 = ceil(**(double **)(in_RDI + 0x18) / 2.0);
      iVar8 = (int)dVar9;
      dVar9 = **(double **)(in_RDI + 0x18);
      for (local_b0 = 1; local_b0 <= iVar8; local_b0 = local_b0 + 1) {
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0,
                   (value_type_conflict3 *)in_stack_fffffffffffffee8);
      }
      if ((int)dVar9 % 2 == 0) {
        in_stack_fffffffffffffee8 = (value_type *)(in_RDI + 0x38);
        std::vector<double,_std::allocator<double>_>::back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
      for (; 1 < iVar8; iVar8 = iVar8 + -1) {
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0,
                   (value_type_conflict3 *)in_stack_fffffffffffffee8);
      }
    }
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38));
    auVar10._8_4_ = (int)(sVar6 >> 0x20);
    auVar10._0_8_ = sVar6;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
    if ((dVar9 != **(double **)(in_RDI + 0x18)) || (NAN(dVar9) || NAN(**(double **)(in_RDI + 0x18)))
       ) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "BSA_SpikeEncodingSynapse: filter length does not matched the generated filter"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    for (local_cc = 0; (double)local_cc < **(double **)(in_RDI + 0x18); local_cc = local_cc + 1) {
    }
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Number of input neurons not equal to number of output neurons");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Number of input neurons not equal to number of output neurons";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

void BSA_SpikeDecodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfOutputNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new ValueEvent());
        input.assign(inputSize, deque<double>(param->filter_length, 0));
    }

    if(param->window == HAMMING) {
        for(int i = 0; i < param->filter_length; i++) {
            filter.push_back((0.54 - 0.46 * cos(6.283185307179586*i/(param->filter_length-1))) * param->scale);
        }
    }
    else if(param->window == TRIANGLE) {
        int middle = ceil(param->filter_length/2.0);
        int len = param->filter_length;
        bool isEven = len % 2 == 0;
        for(int i = 1; i <= middle; i++) {
            filter.push_back((i) / (double)middle * param->scale);
        }
        if(isEven) {
            filter.push_back(filter.back());
        }
        for(int i = middle; i > 1; i--) {
            filter.push_back((i-1) / (double)middle * param->scale);
        }
    }
    if(filter.size() != param->filter_length) {
        cout << "BSA_SpikeEncodingSynapse: filter length does not matched the generated filter" << endl;
    }
    // filter = vector<double>{0.05942473828591342,0.07318223830709897,0.11232230333947553,0.17484795255681723,0.25675440297792484,0.3523237031416342,0.454573094246691,0.5558198517560227,0.6483143637949771,0.724886509451,0.7795486730754763,0.8080021690669681,0.8080021690669681,0.7795486730754763,0.724886509451,0.6483143637949771,0.5558198517560227,0.45457309424669107,0.3523237031416343,0.256754402977925,0.17484795255681737,0.11232230333947553,0.07318223830709897,0.05942473828591342};
    // filter = vector<double>{0.0,0.030303030303030304,0.06060606060606061,0.0909090909090909,0.12121212121212122,0.15151515151515152,0.1818181818181818,0.21212121212121213,0.24242424242424243,0.27272727272727276,0.30303030303030304,0.27272727272727276,0.24242424242424243,0.21212121212121213,0.1818181818181818,0.15151515151515152,0.12121212121212122,0.0909090909090909,0.06060606060606061,0.030303030303030304,0.0};
    for(int i = 0; i < param->filter_length; i++) {
        // TODO add
        // filter.push_back(0.5);
    }
}